

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O1

s32 __thiscall irr::gui::CGUIEditBox::getCursorPos(CGUIEditBox *this,s32 x,s32 y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  
  plVar4 = (long *)(**(code **)(*(long *)this + 0x130))();
  if ((this->WordWrap != false) || (iVar6 = 1, this->MultiLine == true)) {
    iVar6 = (int)((ulong)((long)(this->BrokenText).m_data.
                                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->BrokenText).m_data.
                               super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  }
  if (iVar6 == 0) {
    puVar9 = (undefined8 *)0x0;
    iVar6 = 0;
  }
  else {
    lVar7 = 0;
    lVar8 = 0;
    do {
      iVar2 = (int)lVar8;
      setTextRect(this,iVar2);
      iVar3 = (this->CurrentTextRect).UpperLeftCorner.Y;
      iVar5 = iVar3;
      if (iVar3 < y) {
        iVar5 = y;
      }
      iVar1 = (this->CurrentTextRect).LowerRightCorner.Y;
      if (iVar2 != 0) {
        iVar5 = y;
      }
      y = iVar1;
      if (iVar5 < iVar1) {
        y = iVar5;
      }
      if (iVar2 - iVar6 != -1) {
        y = iVar5;
      }
      if (y <= iVar1 && iVar3 <= y) {
        if ((this->WordWrap == false) && (this->MultiLine != true)) {
          puVar9 = (undefined8 *)&this->field_0xa8;
        }
        else {
          puVar9 = (undefined8 *)
                   ((long)(this->BrokenText).m_data.
                          super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - lVar7);
        }
        if ((this->WordWrap != false) || (iVar6 = 0, this->MultiLine == true)) {
          iVar6 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar8];
        }
        goto LAB_00218a93;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -0x20;
    } while ((int)lVar8 != iVar6);
    puVar9 = (undefined8 *)0x0;
    iVar6 = 0;
  }
LAB_00218a93:
  iVar3 = 0;
  if (puVar9 != (undefined8 *)0x0) {
    iVar3 = (this->CurrentTextRect).UpperLeftCorner.X;
    iVar2 = x + 3;
    if (x + 3 <= iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = (**(code **)(*plVar4 + 0x10))(plVar4,*puVar9,iVar2 - iVar3);
    if (iVar3 == -1) {
      iVar3 = *(int *)(puVar9 + 1);
    }
    iVar3 = iVar3 + iVar6;
  }
  return iVar3;
}

Assistant:

s32 CGUIEditBox::getCursorPos(s32 x, s32 y)
{
	IGUIFont *font = getActiveFont();

	const u32 lineCount = (WordWrap || MultiLine) ? BrokenText.size() : 1;

	core::stringw *txtLine = 0;
	s32 startPos = 0;
	x += 3;

	for (u32 i = 0; i < lineCount; ++i) {
		setTextRect(i);
		if (i == 0 && y < CurrentTextRect.UpperLeftCorner.Y)
			y = CurrentTextRect.UpperLeftCorner.Y;
		if (i == lineCount - 1 && y > CurrentTextRect.LowerRightCorner.Y)
			y = CurrentTextRect.LowerRightCorner.Y;

		// is it inside this region?
		if (y >= CurrentTextRect.UpperLeftCorner.Y && y <= CurrentTextRect.LowerRightCorner.Y) {
			// we've found the clicked line
			txtLine = (WordWrap || MultiLine) ? &BrokenText[i] : &Text;
			startPos = (WordWrap || MultiLine) ? BrokenTextPositions[i] : 0;
			break;
		}
	}

	if (x < CurrentTextRect.UpperLeftCorner.X)
		x = CurrentTextRect.UpperLeftCorner.X;

	if (!txtLine)
		return 0;

	s32 idx = font->getCharacterFromPos(txtLine->c_str(), x - CurrentTextRect.UpperLeftCorner.X);

	// click was on or left of the line
	if (idx != -1)
		return idx + startPos;

	// click was off the right edge of the line, go to end.
	return txtLine->size() + startPos;
}